

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O1

void __thiscall
hedg::MarketGenerator::MarketGenerator(MarketGenerator *this,int time_span,time_unit time_unit)

{
  (this->session_id_)._M_dataplus._M_p = (pointer)&(this->session_id_).field_2;
  (this->session_id_)._M_string_length = 0;
  (this->session_id_).field_2._M_local_buf[0] = '\0';
  this->time_span_ = time_span;
  this->time_unit_ = time_unit;
  std::condition_variable::condition_variable(&this->data_cond_);
  (this->markets_).c.
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->markets_).c.
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->markets_).c.
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->markets_).c.
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->markets_).c.
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->markets_).c.
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->markets_).c.
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->markets_).c.
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->markets_).c.
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->mut_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->markets_).c.
  super__Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mut_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mut_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mut_).super___mutex_base._M_mutex + 8) = 0;
  std::
  _Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>
                       *)&this->markets_,0);
  return;
}

Assistant:

MarketGenerator::MarketGenerator(int time_span, Timing::time_unit time_unit) : time_span_{ time_span }, time_unit_{ time_unit } {}